

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::Init
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          MeshEdgebreakerEncoder *encoder)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  EncoderOptions *this_00;
  EncoderOptionsBase<int> *this_01;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  key_type local_48;
  
  this->encoder_ = encoder;
  this->mesh_ = (encoder->super_MeshEncoder).mesh_;
  piVar2 = (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish != piVar2) {
    (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  this_00 = (encoder->super_MeshEncoder).super_PointCloudEncoder.options_;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"split_mesh_on_seams","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_01 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.options_;
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(this_00->super_DracoOptions<int>).global_options_.options_._M_t._M_impl.
       super__Rb_tree_header) {
    iVar4 = EncoderOptionsBase<int>::GetSpeed(this_01);
    if (iVar4 < 6) {
      this->use_single_connectivity_ = false;
    }
    else {
      this->use_single_connectivity_ = true;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"split_mesh_on_seams","");
    bVar3 = Options::GetBool((Options *)this_01,&local_48,false);
    this->use_single_connectivity_ = bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::Init(
    MeshEdgebreakerEncoder *encoder) {
  encoder_ = encoder;
  mesh_ = encoder->mesh();
  attribute_encoder_to_data_id_map_.clear();

  if (encoder_->options()->IsGlobalOptionSet("split_mesh_on_seams")) {
    use_single_connectivity_ =
        encoder_->options()->GetGlobalBool("split_mesh_on_seams", false);
  } else if (encoder_->options()->GetSpeed() >= 6) {
    // Else use default setting based on speed.
    use_single_connectivity_ = true;
  } else {
    use_single_connectivity_ = false;
  }
  return true;
}